

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeLoad(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Load *pLVar2;
  reference this_00;
  pointer pMVar3;
  bool local_51;
  Load *load;
  TranslateToFuzzReader *local_38;
  Expression *local_30;
  Expression *ret;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  if (((this->allowMemory & 1U) == 0) || (bVar1 = Type::isRef((Type *)&this_local), bVar1)) {
    ret = (Expression *)this_local;
    type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
  }
  else {
    local_38 = this_local;
    local_30 = makeNonAtomicLoad(this,(Type)this_local);
    load._4_4_ = 2;
    bVar1 = Type::operator!=((Type *)&this_local,(BasicType *)((long)&load + 4));
    local_51 = false;
    if (bVar1) {
      load._0_4_ = 3;
      local_51 = Type::operator!=((Type *)&this_local,(BasicType *)&load);
    }
    if (local_51 == false) {
      bVar1 = FeatureSet::hasAtomics(&this->wasm->features);
      if ((!bVar1) || (bVar1 = oneIn(this,2), bVar1)) {
        type_local.id = (uintptr_t)local_30;
      }
      else {
        pLVar2 = Expression::cast<wasm::Load>(local_30);
        this_00 = std::
                  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ::operator[](&this->wasm->memories,0);
        pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                           (this_00);
        pMVar3->shared = true;
        pLVar2->isAtomic = true;
        pLVar2->signed_ = false;
        Address::operator=(&pLVar2->align,(ulong)pLVar2->bytes);
        type_local.id = (uintptr_t)pLVar2;
      }
    }
    else {
      type_local.id = (uintptr_t)local_30;
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeLoad(Type type) {
  // reference types cannot be stored in memory
  if (!allowMemory || type.isRef()) {
    return makeTrivial(type);
  }
  auto* ret = makeNonAtomicLoad(type);
  if (type != Type::i32 && type != Type::i64) {
    return ret;
  }
  if (!wasm.features.hasAtomics() || oneIn(2)) {
    return ret;
  }
  // make it atomic
  auto* load = ret->cast<Load>();
  wasm.memories[0]->shared = true;
  load->isAtomic = true;
  load->signed_ = false;
  load->align = load->bytes;
  return load;
}